

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStringEq(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Nullability NVar2;
  HeapType local_78;
  Expression *local_70;
  Expression *right;
  Expression *local_60;
  Expression *left;
  Type local_50;
  Expression *local_48;
  Expression *right_1;
  Type local_38;
  Expression *local_30;
  Expression *left_1;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  left_1._4_4_ = 2;
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::operator==((Type *)&this_local,(BasicType *)((long)&left_1 + 4));
  if (!bVar1) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xe9b,"Expression *wasm::TranslateToFuzzReader::makeStringEq(Type)");
  }
  bVar1 = oneIn(this,2);
  if (bVar1) {
    HeapType::HeapType((HeapType *)&right_1,string);
    NVar2 = getNullability(this);
    Type::Type(&local_38,(HeapType)right_1,NVar2,Inexact);
    local_30 = make(this,local_38);
    HeapType::HeapType((HeapType *)&left,string);
    NVar2 = getNullability(this);
    Type::Type(&local_50,(HeapType)left,NVar2,Inexact);
    local_48 = make(this,local_50);
    type_local.id = (uintptr_t)Builder::makeStringEq(&this->builder,StringEqEqual,local_30,local_48)
    ;
  }
  else {
    HeapType::HeapType((HeapType *)&right,string);
    local_60 = makeTrappingRefUse(this,(HeapType)right);
    HeapType::HeapType(&local_78,string);
    local_70 = makeTrappingRefUse(this,local_78);
    type_local.id =
         (uintptr_t)Builder::makeStringEq(&this->builder,StringEqCompare,local_60,local_70);
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringEq(Type type) {
  assert(type == Type::i32);

  if (oneIn(2)) {
    auto* left = make(Type(HeapType::string, getNullability()));
    auto* right = make(Type(HeapType::string, getNullability()));
    return builder.makeStringEq(StringEqEqual, left, right);
  }

  // string.compare may trap if the either input is null.
  auto* left = makeTrappingRefUse(HeapType::string);
  auto* right = makeTrappingRefUse(HeapType::string);
  return builder.makeStringEq(StringEqCompare, left, right);
}